

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O0

void test_open_address_dictionary_cursor_range(planck_unit_test_t *tc)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  char cVar3;
  int iVar4;
  char *__s;
  ion_value_t str;
  ion_cursor_status_t cursor_status;
  int *piStack_c8;
  int result_count;
  ion_record_t record;
  undefined1 local_b0 [8];
  ion_predicate_t predicate;
  ion_dict_cursor_t *cursor;
  ion_dictionary_t test_dictionary;
  ion_dictionary_handler_t map_handler;
  ion_record_info_t record_info;
  int size;
  planck_unit_test_t *tc_local;
  
  map_handler.close_dictionary._4_4_ = 4;
  createTestDictionary
            ((ion_dictionary_handler_t *)&test_dictionary.handler,
             (ion_record_info_t *)((long)&map_handler.close_dictionary + 4),10,
             (ion_dictionary_t *)&cursor,key_type_numeric_signed);
  record.value._4_4_ = 1;
  record.value._0_4_ = 5;
  dictionary_build_predicate
            ((ion_predicate_t *)local_b0,'\x01',(undefined1 *)((long)&record.value + 4),
             &record.value);
  iVar1 = dictionary_find((ion_dictionary_t *)&cursor,(ion_predicate_t *)local_b0,
                          (ion_dict_cursor_t **)&predicate.destroy);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\0'),0x1ed,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(*predicate.destroy == (_func_void_ion_predicate_t_ptr_ptr)0x2),0x1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  record.key = malloc(10);
  piStack_c8 = (int *)malloc((long)map_handler.close_dictionary._4_4_);
  str._4_4_ = 0;
  while( true ) {
    cVar3 = (**(code **)(predicate.destroy + 0x18))(predicate.destroy,&stack0xffffffffffffff38);
    if (cVar3 != '\x04') {
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(str._4_4_ == 5),0x20b,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                         ,"condition was false, expected true");
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      cVar3 = (**(code **)(predicate.destroy + 0x18))(predicate.destroy,&stack0xffffffffffffff38);
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(cVar3 == '\x01'),0x20e,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                         ,"condition was false, expected true");
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      (**(code **)(predicate.destroy + 0x20))(&predicate.destroy);
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(predicate.destroy == (_func_void_ion_predicate_t_ptr_ptr *)0x0),
                         0x214,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                         ,"condition was false, expected true");
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      free(piStack_c8);
      free(record.key);
      dictionary_delete_dictionary((ion_dictionary_t *)&cursor);
      return;
    }
    pVar2 = planck_unit_assert_true
                      (tc,1,0x1fc,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    __s = (char *)malloc(10);
    sprintf(__s,"value : %i",(ulong)(uint)(*(int *)predicate._0_8_ + str._4_4_));
    iVar4 = memcmp(record.key,__s,10);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(iVar4 == 0),0x204,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') break;
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(**(int **)(*(long *)(predicate.destroy + 0x10) + 8) <= *piStack_c8)
                       ,0x205,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(*piStack_c8 <=
                                **(int **)(*(long *)(predicate.destroy + 0x10) + 0x10)),0x206,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    str._4_4_ = str._4_4_ + 1;
    free(__s);
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_dictionary_cursor_range(
	planck_unit_test_t *tc
) {
	int					size;
	ion_record_info_t	record_info;

	/* this is required for initializing the hash map and should come from the dictionary */
	record_info.key_size	= sizeof(int);
	record_info.value_size	= 10;
	size					= 10;

	ion_dictionary_handler_t	map_handler;			/* create handler for hashmap */
	ion_dictionary_t			test_dictionary;		/* dictionary handler for test instance */

	createTestDictionary(&map_handler, &record_info, size, &test_dictionary, key_type_numeric_signed);

	ion_dict_cursor_t *cursor;	/* create a new cursor */

	/* create a new predicate statement */
	ion_predicate_t predicate;

	dictionary_build_predicate(&predicate, predicate_range, IONIZE(1, int), IONIZE(5, int));
	/* test that the query runs on dictionary instance okay */
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == dictionary_find(&test_dictionary, &predicate, &cursor));

	/* check the status of the cursor as it should be initialized */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_initialized == cursor->status);

	/* user must allocate memory before calling next() */
	ion_record_t record;

	record.value	= malloc(record_info.value_size);
	record.key		= malloc(record_info.key_size);

	int					result_count = 0;
	ion_cursor_status_t cursor_status;

	while (cs_cursor_active == (cursor_status = cursor->next(cursor, &record))) {
		PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_active == cursor_status);

		/* check that value is correct that has been returned */
		ion_value_t str;

		str = malloc(record_info.value_size);
		sprintf((char *) str, "value : %i", (*(int *) predicate.statement.range.lower_bound) + result_count);

		PLANCK_UNIT_ASSERT_TRUE(tc, ION_IS_EQUAL == memcmp(record.value, str, record_info.value_size));
		PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) (record.key) >= *(int *) (cursor->predicate->statement.range.lower_bound));
		PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) (record.key) <= *(int *) (cursor->predicate->statement.range.upper_bound));
		result_count++;
		free(str);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, 5 == result_count);

	/* and as there is only 1 result, the next call should return empty */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_end_of_results == cursor->next(cursor, &record));

	/* destroy the cursor */
	cursor->destroy(&cursor);

	/* and check that cursor has been destroyed correctly */
	PLANCK_UNIT_ASSERT_TRUE(tc, NULL == cursor);

	free(record.key);
	free(record.value);

	/* and destroy the dictionary instance */
	dictionary_delete_dictionary(&test_dictionary);
}